

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O0

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (ClockVisitor *this,AbortAssertionExpr *expr,Clock outerClock,
          bitmask<slang::analysis::VisitFlags> flags)

{
  AssertionExpr *in_RCX;
  long in_RDX;
  VisitResult *in_RDI;
  Clock in_stack_00000030;
  VisitResult result;
  VisitResult *in_stack_ffffffffffffff68;
  VisitResult *this_00;
  bitmask<slang::analysis::VisitFlags> *in_stack_ffffffffffffffc0;
  TimingControl **in_stack_ffffffffffffffc8;
  ClockVisitor *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  ast::AssertionExpr::
  visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
            (in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if ((*(byte *)(in_RDX + 0x24) & 1) == 0) {
    VisitResult::VisitResult(this_00,in_stack_ffffffffffffff68);
  }
  else {
    inheritedClock((ClockVisitor *)
                   result.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.len,
                   (AssertionExpr *)
                   result.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_,
                   in_stack_00000030,
                   result.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.cap._4_4_)
    ;
  }
  VisitResult::~VisitResult((VisitResult *)0xad5460);
  return in_RDI;
}

Assistant:

VisitResult visit(const AbortAssertionExpr& expr, Clock outerClock, bitmask<VF> flags) {
        auto result = expr.expr.visit(*this, outerClock, flags);
        if (!expr.isSync)
            return result;
        return inheritedClock(expr, outerClock, flags);
    }